

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

Vec3f __thiscall Raytracer::Camera::WorldToCamera(Camera *this,Vec3f *pos,Image *image)

{
  int iVar1;
  long in_RCX;
  double dVar2;
  undefined8 extraout_XMM0_Qa;
  float fVar3;
  Vec3f VVar4;
  float local_34;
  float local_30;
  float z;
  float y;
  float x;
  Image *image_local;
  Vec3f *pos_local;
  Camera *this_local;
  Vec3f *direction;
  
  z = *(float *)&image->datas - (float)(*(int *)(in_RCX + 8) / 2);
  local_30 = *(float *)((long)&image->datas + 4) - (float)(*(int *)(in_RCX + 0xc) / 2);
  iVar1 = *(int *)(in_RCX + 8);
  image_local = image;
  pos_local = pos;
  this_local = this;
  dVar2 = tan((double)(pos[1].x * 0.5));
  dVar2 = dVar2 + dVar2;
  local_34 = (float)((double)-iVar1 / dVar2);
  Vec3<float>::Vec3(&this->origin,&z,&local_30,&local_34);
  fVar3 = SUB84(dVar2,0);
  Vec3<float>::normalize(&this->origin);
  VVar4.z = fVar3;
  VVar4.x = (float)(int)extraout_XMM0_Qa;
  VVar4.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar4;
}

Assistant:

Vec3f Raytracer::Camera::WorldToCamera(const Vec3f &pos ,const Raytracer::Image& image) const{

    float x = pos.x-(image.width/2);
    float y  = pos.y-(image.height/2);
    float z = -image.width / (2 * tan(fov /2));
    Vec3f direction(x, y, z);
    direction.normalize();
    return direction;

}